

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationvisitor.cpp
# Opt level: O1

void __thiscall
CalculationVisitor::defineVariable
          (CalculationVisitor *this,BinaryOperatorExpression *expression,
          VariableExpression *variable)

{
  iterator *piVar1;
  Environment *this_00;
  ResultValue value_00;
  Expression *pEVar2;
  _Elt_pointer pRVar3;
  ResultValue value;
  ResultValue local_78;
  string local_48;
  
  pEVar2 = BinaryOperatorExpression::rightHandSide(expression);
  (*pEVar2->_vptr_Expression[2])(pEVar2,this,expression);
  pRVar3 = (this->mEvaluationStack).c.super__Deque_base<ResultValue,_std::allocator<ResultValue>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pRVar3 == (this->mEvaluationStack).c.
                super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pRVar3 = (this->mEvaluationStack).c.super__Deque_base<ResultValue,_std::allocator<ResultValue>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
  }
  local_78.mComplexValue._M_value._8_8_ = *(undefined8 *)(pRVar3[-1].mComplexValue._M_value + 8);
  local_78.mType = pRVar3[-1].mType;
  local_78._4_4_ = *(undefined4 *)&pRVar3[-1].field_0x4;
  local_78.mIntValue = pRVar3[-1].mIntValue;
  local_78.mFloatValue = pRVar3[-1].mFloatValue;
  local_78.mComplexValue._M_value._0_8_ = *(undefined8 *)pRVar3[-1].mComplexValue._M_value;
  std::deque<ResultValue,_std::allocator<ResultValue>_>::pop_back(&(this->mEvaluationStack).c);
  this_00 = this->mEnvironment;
  VariableExpression::name_abi_cxx11_(&local_48,variable);
  value_00.mIntValue = local_78.mIntValue;
  value_00.mType = local_78.mType;
  value_00._4_4_ = local_78._4_4_;
  value_00.mFloatValue = local_78.mFloatValue;
  value_00.mComplexValue._M_value._0_8_ = local_78.mComplexValue._M_value._0_8_;
  value_00.mComplexValue._M_value._8_8_ = local_78.mComplexValue._M_value._8_8_;
  Environment::set(this_00,&local_48,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pRVar3 = (this->mEvaluationStack).c.super__Deque_base<ResultValue,_std::allocator<ResultValue>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pRVar3 == (this->mEvaluationStack).c.
                super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<ResultValue,std::allocator<ResultValue>>::_M_push_back_aux<ResultValue_const&>
              ((deque<ResultValue,std::allocator<ResultValue>> *)&this->mEvaluationStack,&local_78);
  }
  else {
    *(undefined8 *)((pRVar3->mComplexValue)._M_value + 8) = local_78.mComplexValue._M_value._8_8_;
    pRVar3->mFloatValue = local_78.mFloatValue;
    *(undefined8 *)(pRVar3->mComplexValue)._M_value = local_78.mComplexValue._M_value._0_8_;
    pRVar3->mType = local_78.mType;
    *(undefined4 *)&pRVar3->field_0x4 = local_78._4_4_;
    pRVar3->mIntValue = local_78.mIntValue;
    piVar1 = &(this->mEvaluationStack).c.
              super__Deque_base<ResultValue,_std::allocator<ResultValue>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void CalculationVisitor::defineVariable(BinaryOperatorExpression* expression, VariableExpression* variable) {
	expression->rightHandSide()->accept(*this, expression);

	auto value = popStack();
	mEnvironment.set(variable->name(), value);
	mEvaluationStack.push(value);
}